

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
* __thiscall
capnp::compiler::Compiler::Node::resolveMember
          (Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
           *__return_storage_ptr__,Node *this,StringPtr name)

{
  undefined4 uVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  uint64_t uVar4;
  _Rb_tree_color _Var5;
  Maybe<capnp::compiler::Compiler::Node::Content_&> MVar6;
  iterator iVar7;
  iterator iVar8;
  key_type local_28;
  
  local_28.content.size_ = name.content.size_;
  local_28.content.ptr = name.content.ptr;
  if ((this->isBuiltin != true) && (MVar6 = getContent(this,EXPANDED), MVar6.ptr != (Content *)0x0))
  {
    iVar7 = std::
            _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node>_>_>_>
            ::find(&((MVar6.ptr)->nestedNodes)._M_t,&local_28);
    if ((_Rb_tree_header *)iVar7._M_node !=
        &((MVar6.ptr)->nestedNodes)._M_t._M_impl.super__Rb_tree_header) {
      p_Var2 = iVar7._M_node[1]._M_right;
      p_Var3 = p_Var2[2]._M_parent;
      uVar1 = *(undefined4 *)&p_Var2[3].field_0x4;
      uVar4 = this->id;
      _Var5 = p_Var2[3]._M_color;
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.tag = 1;
      *(_Base_ptr *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = p_Var3;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = uVar1;
      *(uint64_t *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) = uVar4;
      *(short *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = (short)_Var5;
      *(_Base_ptr *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = p_Var2;
      *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = 0;
      return __return_storage_ptr__;
    }
    iVar8 = std::
            _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_>_>_>
            ::find(&((MVar6.ptr)->aliases)._M_t,&local_28);
    if ((_Rb_tree_header *)iVar8._M_node !=
        &((MVar6.ptr)->aliases)._M_t._M_impl.super__Rb_tree_header) {
      Alias::compile(__return_storage_ptr__,(Alias *)iVar8._M_node[1]._M_right);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::Resolver::ResolveResult>
Compiler::Node::resolveMember(kj::StringPtr name) {
  if (isBuiltin) return nullptr;

  KJ_IF_MAYBE(content, getContent(Content::EXPANDED)) {
    {
      auto iter = content->nestedNodes.find(name);
      if (iter != content->nestedNodes.end()) {
        Node* node = iter->second;
        ResolveResult result;
        result.init<ResolvedDecl>(ResolvedDecl {
            node->id, node->genericParamCount, id, node->kind, node, nullptr });
        return result;
      }
    }
    {
      auto iter = content->aliases.find(name);
      if (iter != content->aliases.end()) {
        return iter->second->compile();
      }
    }
  }
  return nullptr;
}